

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::copyValueFrom
          (TypedAttribute<Imath_3_2::Matrix33<float>_> *this,Attribute *other)

{
  TypedAttribute<Imath_3_2::Matrix33<float>_> *pTVar1;
  long in_RDI;
  
  pTVar1 = cast((Attribute *)0x2001f1);
  Imath_3_2::Matrix33<float>::operator=((Matrix33<float> *)(in_RDI + 8),&pTVar1->_value);
  return;
}

Assistant:

void
TypedAttribute<T>::copyValueFrom (const Attribute& other)
{
    _value = cast (other)._value;
}